

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDefinition.cpp
# Opt level: O2

void __thiscall
Rml::ElementDefinition::ElementDefinition
          (ElementDefinition *this,Vector<const_StyleSheetNode_*> *style_sheet_nodes)

{
  pointer ppSVar1;
  NodePtr pDVar2;
  pair<Rml::PropertyId,_Rml::Property> *property;
  PropertyDictionary *other;
  PropertyMap *this_00;
  size_t i;
  ulong uVar3;
  const_iterator __begin1;
  const_iterator local_30;
  
  PropertyDictionary::PropertyDictionary(&this->properties);
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  for (uVar3 = 0;
      ppSVar1 = (style_sheet_nodes->
                super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(style_sheet_nodes->
                            super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
      uVar3 = uVar3 + 1) {
    other = StyleSheetNode::GetProperties(ppSVar1[uVar3]);
    PropertyDictionary::Merge(&this->properties,other,0);
  }
  this_00 = PropertyDictionary::GetProperties(&this->properties);
  local_30 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::cbegin(this_00);
  pDVar2 = (NodePtr)this_00->mInfo;
  while (local_30.mKeyVals != pDVar2) {
    PropertyIdSet::Insert(&this->property_ids,((local_30.mKeyVals)->mData).first);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++(&local_30);
  }
  return;
}

Assistant:

ElementDefinition::ElementDefinition(const Vector<const StyleSheetNode*>& style_sheet_nodes)
{
	// Initialises the element definition from the list of style sheet nodes.
	for (size_t i = 0; i < style_sheet_nodes.size(); ++i)
		properties.Merge(style_sheet_nodes[i]->GetProperties());

	for (auto& property : properties.GetProperties())
		property_ids.Insert(property.first);
}